

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclDevice.cpp
# Opt level: O0

void __thiscall xmrig::OclDevice::toJSON(OclDevice *this,Value *out,Document *doc)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  String *in_RSI;
  OclDevice *in_RDI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  OclDevice *in_stack_fffffffffffffef0;
  Document *in_stack_ffffffffffffff00;
  Document *doc_00;
  String *in_stack_ffffffffffffff08;
  PciTopology *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  StringRefType *in_stack_ffffffffffffff48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff50;
  undefined1 local_a0 [32];
  GenericStringRef<char> local_80;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_70;
  GenericStringRef<char> local_60 [2];
  undefined1 local_40 [32];
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  String *local_10;
  
  local_10 = in_RSI;
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>
            ((GenericStringRef<char> *)(local_40 + 0x10),(char (*) [6])"board");
  board(in_stack_fffffffffffffef0);
  allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_40;
  String::toJSON(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_40);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(local_60,(char (*) [5])"name");
  name(in_RDI);
  this_00 = (PciTopology *)&local_70;
  String::toJSON(local_10,in_stack_ffffffffffffff00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_70);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_80,(char (*) [7])"bus_id");
  topology(in_RDI);
  doc_00 = (Document *)local_a0;
  PciTopology::toString(this_00);
  String::toJSON(local_10,doc_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),allocator_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)(local_a0 + 0x10));
  String::~String((String *)in_stack_fffffffffffffef0);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff50,(char (*) [3])"cu");
  computeUnits(in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff40,(char (*) [11])"global_mem");
  globalMemSize(in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),allocator_00);
  return;
}

Assistant:

void xmrig::OclDevice::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    out.AddMember("board",       board().toJSON(doc), allocator);
    out.AddMember("name",        name().toJSON(doc), allocator);
    out.AddMember("bus_id",      topology().toString().toJSON(doc), allocator);
    out.AddMember("cu",          computeUnits(), allocator);
    out.AddMember("global_mem",  static_cast<uint64_t>(globalMemSize()), allocator);
}